

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

sample_type __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::encoder_strategy>
::do_regular(jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::encoder_strategy>
             *this,int32_t qs,int32_t x,int32_t predicted,encoder_strategy *param_4)

{
  default_traits<unsigned_short,_charls::quad<unsigned_short>_> *this_00;
  unsigned_short uVar1;
  int iVar2;
  int32_t k;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  context_regular_mode *this_01;
  uint uVar9;
  uint uVar10;
  
  uVar9 = qs >> 0x1f;
  iVar2 = -qs;
  if (0 < qs) {
    iVar2 = qs;
  }
  this_01 = (this->contexts_)._M_elems + iVar2;
  k = context_regular_mode::get_golomb_coding_parameter(this_01);
  this_00 = &this->traits_;
  uVar6 = 0;
  uVar3 = (((this->contexts_)._M_elems[iVar2].c_ ^ uVar9) - uVar9) + predicted;
  uVar4 = (this->traits_).maximum_sample_value;
  uVar10 = uVar4;
  if ((int)uVar3 < 0) {
    uVar10 = 0;
  }
  if ((uVar3 & ~uVar4) == 0) {
    uVar10 = uVar3;
  }
  iVar5 = (this->traits_).near_lossless;
  iVar7 = (x - uVar10 ^ uVar9) - uVar9;
  iVar8 = -iVar5;
  if (0 < iVar7) {
    iVar8 = iVar5;
  }
  uVar4 = default_traits<unsigned_short,_charls::quad<unsigned_short>_>::modulo_range
                    (this_00,(iVar8 + iVar7) / (iVar5 * 2 + 1));
  if ((this->traits_).near_lossless == 0 && k == 0) {
    uVar6 = (this->contexts_)._M_elems[iVar2].n_ + (this->contexts_)._M_elems[iVar2].b_ * 2 + -1 >>
            0x1f;
  }
  uVar6 = uVar6 ^ uVar4;
  if ((int)uVar6 < 0x40000000) {
    encode_mapped_value(this,k,uVar6 * 2 ^ (int)uVar6 >> 0x1e,(this->traits_).limit);
    context_regular_mode::update_variables_and_bias
              (this_01,uVar4,(this->traits_).near_lossless,(this->traits_).reset_threshold);
    iVar8 = (uVar4 ^ uVar9) - uVar9;
    uVar1 = default_traits<unsigned_short,_charls::quad<unsigned_short>_>::fix_reconstructed_value
                      (this_00,((this->traits_).near_lossless * 2 + 1) * iVar8 + uVar10);
    iVar5 = (uint)uVar1 - x;
    iVar2 = -iVar5;
    if (0 < iVar5) {
      iVar2 = iVar5;
    }
    iVar5 = (this->traits_).near_lossless;
    if (iVar2 <= iVar5) {
      uVar1 = default_traits<unsigned_short,_charls::quad<unsigned_short>_>::fix_reconstructed_value
                        (this_00,(iVar5 * 2 + 1) * iVar8 + uVar10);
      return uVar1;
    }
    __assert_fail("traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x15c,
                  "sample_type charls::jls_codec<charls::default_traits<unsigned short, charls::quad<unsigned short>>, charls::encoder_strategy>::do_regular(const int32_t, const int32_t, const int32_t, encoder_strategy *) [Traits = charls::default_traits<unsigned short, charls::quad<unsigned short>>, Strategy = charls::encoder_strategy]"
                 );
  }
  __assert_fail("error_value <= std::numeric_limits<int32_t>::max() / 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                ,0x51,"int32_t charls::map_error_value(const int32_t)");
}

Assistant:

do_regular(const int32_t qs, const int32_t x, const int32_t predicted,
                                        encoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};
        const int32_t error_value{traits_.compute_error_value(apply_sign(x - predicted_value, sign))};

        encode_mapped_value(k, map_error_value(context.get_error_correction(k | traits_.near_lossless) ^ error_value),
                            traits_.limit);
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        ASSERT(traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x));
        return static_cast<sample_type>(
            traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)));
    }